

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9ChainBmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  Vec_Ptr_t *__ptr;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint fVeryVerbose;
  char *pcVar5;
  uint fVerbose;
  long lVar6;
  Vec_Ptr_t *vCexes;
  uint local_48;
  uint local_44;
  Vec_Ptr_t *local_38;
  
  local_38 = (Vec_Ptr_t *)0x0;
  local_44 = 0;
  Extra_UtilGetoptReset();
  local_48 = 200;
  fVerbose = 0;
  fVeryVerbose = 0;
LAB_0028c3bb:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"FCvwh"), iVar3 = globalUtilOptind, iVar1 == 0x77) {
      fVeryVerbose = fVeryVerbose ^ 1;
    }
    if (iVar1 < 0x46) {
      if (iVar1 == -1) {
        p = pAbc->pGia;
        if (p == (Gia_Man_t *)0x0) {
          pcVar4 = "Abc_CommandAbc9ChainBmc(): There is no AIG.\n";
        }
        else {
          if (p->nRegs != 0) {
            Bmc_ChainTest(p,local_48,local_44,fVerbose,fVeryVerbose,&local_38);
            __ptr = local_38;
            if (local_38 == (Vec_Ptr_t *)0x0) {
              return 0;
            }
            iVar3 = local_38->nSize;
            if (0 < iVar3) {
              lVar6 = 0;
              do {
                if ((void *)0x2 < __ptr->pArray[lVar6]) {
                  free(__ptr->pArray[lVar6]);
                  iVar3 = __ptr->nSize;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < iVar3);
            }
            if (__ptr->pArray != (void **)0x0) {
              free(__ptr->pArray);
            }
            free(__ptr);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9ChainBmc(): The AIG is combinational.\n";
        }
        Abc_Print(-1,pcVar4);
        return 0;
      }
      if (iVar1 != 0x43) goto LAB_0028c530;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0028c524:
        Abc_Print(-1,pcVar4);
        goto LAB_0028c530;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    else {
      if (iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
        goto LAB_0028c3bb;
      }
      if (iVar1 != 0x46) goto LAB_0028c530;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0028c524;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = uVar2;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_0028c530:
      Abc_Print(-2,"usage: &chainbmc [-FC <num>] [-vwh]\n");
      Abc_Print(-2,"\t           runs a specialized flavor of BMC\n");
      Abc_Print(-2,"\t-F <num> : the max number of timeframes (0 = unused) [default = %d]\n",
                (ulong)local_48);
      Abc_Print(-2,"\t-C <num> : the max number of conflicts (0 = unused) [default = %d]\n",
                (ulong)local_44);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar4);
      if (fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing even more information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ChainBmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Bmc_ChainTest( Gia_Man_t * p, int nFrameMax, int nConfMax, int fVerbose, int fVeryVerbose, Vec_Ptr_t ** pvCexes );
    Vec_Ptr_t * vCexes = NULL;
    int nFrameMax    =  200;
    int nConfMax     =    0;
    int fVerbose     =    0;
    int fVeryVerbose =    0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrameMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrameMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ChainBmc(): There is no AIG.\n" );
        return 0;
    }
    if ( !Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9ChainBmc(): The AIG is combinational.\n" );
        return 0;
    }
    Bmc_ChainTest( pAbc->pGia, nFrameMax, nConfMax, fVerbose, fVeryVerbose, &vCexes );
    if ( vCexes ) Vec_PtrFreeFree( vCexes );
    //pAbc->Status  = ...;
    //pAbc->nFrames = pPars->iFrame;
    //Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;
usage:
    Abc_Print( -2, "usage: &chainbmc [-FC <num>] [-vwh]\n" );
    Abc_Print( -2, "\t           runs a specialized flavor of BMC\n" );
    Abc_Print( -2, "\t-F <num> : the max number of timeframes (0 = unused) [default = %d]\n", nFrameMax );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts (0 = unused) [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing even more information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}